

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# respond.c
# Opt level: O3

void resp0_ctx_init(void *carg,void *sarg)

{
  *(undefined8 *)((long)carg + 0x38) = 0;
  *(undefined8 *)((long)carg + 0x40) = 0;
  *(undefined8 *)((long)carg + 0x28) = 0;
  *(undefined8 *)((long)carg + 0x30) = 0;
  *(undefined8 *)((long)carg + 0x48) = 0;
  *(void **)carg = sarg;
  *(undefined4 *)((long)carg + 8) = 0;
  return;
}

Assistant:

static void
resp0_ctx_init(void *carg, void *sarg)
{
	resp0_sock *s   = sarg;
	resp0_ctx  *ctx = carg;

	NNI_LIST_NODE_INIT(&ctx->sqnode);
	NNI_LIST_NODE_INIT(&ctx->rqnode);
	ctx->btrace_len = 0;
	ctx->sock       = s;
	ctx->pipe_id    = 0;
}